

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O2

TRef crec_ct_tv(jit_State *J,CType *d,TRef dp,TRef sp,cTValue *sval)

{
  ushort uVar1;
  uint k;
  CTSize CVar2;
  TraceError e;
  byte bVar3;
  IRRef1 IVar4;
  ushort uVar5;
  IRType IVar6;
  IRType IVar7;
  IRType IVar8;
  TRef TVar9;
  uint uVar10;
  CTypeID CVar11;
  TRef TVar12;
  ulong uVar13;
  GCcdata *pGVar14;
  CType *pCVar15;
  IRRef1 IVar16;
  ushort uVar17;
  uint uVar18;
  CTState *pCVar19;
  IRRef1 IVar20;
  CType *ct;
  int32_t k_00;
  CTInfo CVar21;
  bool bVar22;
  bool bVar23;
  double *local_40;
  CTSize ofs;
  
  pCVar19 = (CTState *)(ulong)J[-1].bpropcache[0xc].mode;
  uVar18 = sp >> 0x18 & 0x1f;
  if (4 < uVar18 - 0xf) {
    uVar10 = sp & 0x1f000000;
    if (uVar10 == 0xe000000) {
      uVar13 = sval->u64;
      uVar18 = 0xe;
      goto LAB_00151722;
    }
    if (uVar18 - 1 < 2) {
      sp = lj_ir_kint(J,(uint)(uVar10 == 0x2000000));
      uVar18 = 3;
      goto LAB_00151e36;
    }
    uVar18 = 0x11;
    if (uVar10 == 0) {
      local_40 = (double *)0x0;
      sp = lj_ir_kptr_(J,IR_KPTR,(void *)0x0);
      goto LAB_00151724;
    }
    IVar16 = (IRRef1)sp;
    if (uVar10 == 0x4000000) {
      if ((d->info & 0xf0000000) != 0x50000000) {
        if ((d->info & 0xfc000000) == 0x30000000) {
          e = LJ_TRERR_BADTYPE;
          goto LAB_001522ba;
        }
        TVar9 = lj_ir_kint64(J,0x10);
        (J->fold).ins.field_0.ot = 0x2909;
        (J->fold).ins.field_0.op1 = IVar16;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
        sp = lj_opt_fold(J);
        uVar18 = 0x14;
        goto LAB_00151e36;
      }
      uVar18 = (sval->u32).lo;
      local_40 = (double *)0x0;
      pCVar15 = lj_ctype_getfieldq(pCVar19,d,&((GCobj *)(ulong)uVar18)->str,&ofs,(CTInfo *)0x0);
      TVar9 = lj_ir_kgc(J,(GCobj *)(ulong)uVar18,IRT_STR);
      (J->fold).ins.field_0.ot = 0x884;
      (J->fold).ins.field_0.op1 = IVar16;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
      lj_opt_fold(J);
      uVar18 = 0x11;
      if (pCVar15 != (CType *)0x0) {
        if ((pCVar15->info & 0xf0000000) == 0xb0000000) {
          local_40 = (double *)(ulong)(ofs != 0);
          sp = lj_ir_kint(J,ofs);
          uVar18 = (uint)(ushort)pCVar15->info;
        }
        else {
          local_40 = (double *)0x0;
        }
      }
      goto LAB_00151724;
    }
    if (uVar10 == 0xc000000) {
      if (*(char *)((ulong)(sval->u32).lo + 6) == '\x01') {
        (J->fold).ins.field_0.op1 = IVar16;
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x4410000c;
        TVar9 = lj_opt_fold(J);
        TVar12 = lj_ir_kint(J,1);
        (J->fold).ins.field_0.ot = 0x893;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar12;
        lj_opt_fold(J);
        (J->fold).ins.field_0.op1 = IVar16;
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x4409000d;
        sp = lj_opt_fold(J);
      }
      else {
        TVar9 = lj_ir_kint64(J,0x18);
        (J->fold).ins.field_0.ot = 0x2909;
        (J->fold).ins.field_0.op1 = IVar16;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
        sp = lj_opt_fold(J);
      }
LAB_00151e36:
      local_40 = (double *)0x0;
      goto LAB_00151724;
    }
    if (uVar10 != 0x3000000) {
      pGVar14 = argv2cdata(J,sp,sval);
      uVar1 = pGVar14->ctypeid;
      pCVar15 = pCVar19->tab;
      CVar21 = pCVar15[uVar1].info;
      uVar18 = (sval->u32).lo;
      if ((CVar21 & 0xf0000000) == 0x60000000) {
        CVar11 = lj_ctype_intern(pCVar19,uVar1 | 0x20030000,8);
        pCVar15 = pCVar19->tab;
        ct = pCVar15 + CVar11;
        CVar21 = pCVar15[CVar11].info;
        IVar6 = IRT_P64;
      }
      else {
        ct = pCVar15 + uVar1;
        IVar6 = crec_ct2irt(pCVar19,ct);
      }
      local_40 = (double *)((ulong)uVar18 + 8);
      uVar1 = (ushort)IVar6;
      if (CVar21 >> 0x1c == 2) {
        (J->fold).ins.field_0.ot = uVar1 | 0x4400;
        (J->fold).ins.field_0.op1 = IVar16;
        (J->fold).ins.field_0.op2 = 0xf;
        sp = lj_opt_fold(J);
        if ((ct->info & 0xf0800000) == 0x20800000) {
          local_40 = (double *)*local_40;
          uVar13 = (ulong)((ct->info & 0xffff) << 4);
          uVar18 = *(uint *)((long)&pCVar19->tab->info + uVar13);
          if ((uVar18 & 0xf0000000) == 0x50000000) {
            uVar13 = (ulong)((uVar18 & 0xffff) << 4);
          }
          ct = (CType *)((long)&pCVar19->tab->info + uVar13);
          IVar6 = crec_ct2irt(pCVar19,ct);
LAB_00152265:
          if ((ct->info < 0x10000000) && (IVar6 != IRT_CDATA)) {
            (J->fold).ins.field_0.ot = (ushort)IVar6 | 0x4500;
            (J->fold).ins.field_0.op1 = (IRRef1)sp;
            (J->fold).ins.field_0.op2 = 0;
            goto LAB_00152299;
          }
        }
      }
      else {
        if (IVar6 - IRT_I64 < 2) {
          (J->fold).ins.field_0.ot = uVar1 | 0x4400;
          (J->fold).ins.field_0.op1 = IVar16;
          (J->fold).ins.field_0.op2 = 0x11;
        }
        else {
          if (1 < IVar6 - IRT_IGC) {
            TVar9 = lj_ir_kint64(J,8);
            (J->fold).ins.field_0.ot = 0x2909;
            (J->fold).ins.field_0.op1 = IVar16;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
            sp = lj_opt_fold(J);
            goto LAB_00152265;
          }
          if (CVar21 >> 0x1c == 5) {
            ct = (CType *)((long)&pCVar15->info + (ulong)((CVar21 & 0xffff) << 4));
          }
          (J->fold).ins.field_0.ot = uVar1 | 0x4400;
          (J->fold).ins.field_0.op1 = IVar16;
          (J->fold).ins.field_0.op2 = 0x10;
        }
LAB_00152299:
        sp = lj_opt_fold(J);
      }
      goto LAB_0015172c;
    }
    goto switchD_001517e9_caseD_3;
  }
  uVar13 = sval->u64;
  uVar18 = 9;
LAB_00151722:
  local_40 = (double *)(ulong)((uVar13 & 0x7fffffffffffffff) != 0);
LAB_00151724:
  ct = (CType *)((long)&pCVar19->tab->info + (ulong)(uVar18 << 4));
LAB_0015172c:
  uVar18 = d->info;
  if ((uVar18 & 0xf0000000) == 0x50000000) {
    uVar13 = (ulong)((uVar18 & 0xffff) << 4);
    d = (CType *)((long)&pCVar19->tab->info + uVar13);
    uVar18 = *(uint *)((long)&pCVar19->tab->info + uVar13);
  }
  pCVar19 = (CTState *)(ulong)J[-1].bpropcache[0xc].mode;
  IVar6 = crec_ct2irt(pCVar19,d);
  IVar7 = crec_ct2irt(pCVar19,ct);
  if ((0x3fffffff < uVar18) || (uVar10 = ct->info, 0x3fffffff < uVar10))
  goto switchD_001517e9_caseD_3;
  k = d->size;
  bVar3 = ((byte)(0xf436fff5fff7f021 >> ((byte)(uVar10 >> 0x18) & 0x3c)) & 0xf) +
          ((byte)(0xf436fff5fff7f021 >> ((byte)(uVar18 >> 0x18) & 0x3c)) & 0xf) * '\b';
  if (0x36 < bVar3) {
    if (bVar3 == 0x3f) goto switchD_001517e9_caseD_36;
    goto switchD_001517e9_caseD_3;
  }
  uVar18 = ct->size;
  IVar20 = (IRRef1)sp;
  uVar17 = (ushort)IVar7;
  IVar16 = (IRRef1)dp;
  uVar1 = (ushort)IVar6;
  switch(bVar3) {
  case 0:
  case 0x2d:
  case 0x2e:
  case 0x2f:
    break;
  case 1:
  case 2:
    if (IVar7 == IRT_CDATA) goto switchD_001517e9_caseD_3;
    if (IVar7 - IRT_FLOAT < 2) {
      TVar9 = lj_ir_knum_u64(J,0);
      IVar4 = (IRRef1)TVar9;
    }
    else if (IVar7 - IRT_I64 < 2) {
      TVar9 = lj_ir_kint64(J,0);
      IVar4 = (IRRef1)TVar9;
    }
    else {
      TVar9 = lj_ir_kint(J,0);
      IVar4 = (IRRef1)TVar9;
    }
    uVar5 = 0x800;
    k_00 = 0;
    if (local_40 == (double *)0x0) goto LAB_00151d9e;
    if (local_40 == (double *)0x1) {
LAB_00151d95:
      uVar5 = 0x900;
      k_00 = 1;
    }
    else {
      CVar2 = ct->size;
      if ((ct->info & 0x4000000) == 0) {
        if (CVar2 == 4) {
          if (*(float *)local_40 != 0.0) goto LAB_00151d95;
        }
        else if (CVar2 == 2) {
          if (*(short *)local_40 != 0) goto LAB_00151d95;
        }
        else if (CVar2 == 1) {
          k_00 = 0;
          if (*(char *)local_40 != '\0') goto LAB_00151d95;
        }
        else if (*local_40 != 0.0) goto LAB_00151d95;
      }
      else {
        if (CVar2 == 4) {
          bVar22 = NAN(*(float *)local_40);
          bVar23 = *(float *)local_40 == 0.0;
        }
        else {
          bVar22 = NAN(*local_40);
          bVar23 = *local_40 == 0.0;
        }
        if ((!bVar23) || (bVar22)) goto LAB_00151d95;
      }
    }
LAB_00151d9e:
    (J->fold).ins.field_0.ot = uVar5 | uVar17 | 0x80;
    (J->fold).ins.field_0.op1 = IVar20;
    (J->fold).ins.field_0.op2 = IVar4;
    lj_opt_fold(J);
    sp = lj_ir_kint(J,k_00);
    break;
  case 8:
  case 9:
switchD_001517e9_caseD_8:
    if ((IVar6 == IRT_CDATA) || (IVar7 == IRT_CDATA)) goto switchD_001517e9_caseD_3;
    if ((k == 8) && ((uVar18 < 8 && ((uVar10 & 0x800000) == 0)))) {
      uVar5 = uVar1 | 0x5900;
      if (uVar18 < 4) {
        IVar7 = IRT_IGC;
      }
      uVar17 = (ushort)(IVar6 << 5) | (ushort)IVar7 | 0x800;
      goto LAB_00151c0a;
    }
    if ((7 < k) || (uVar18 != 8)) {
      if (IVar7 == IRT_IGC) {
        sp = lj_opt_narrow_toint(J,sp);
      }
      break;
    }
    IVar8 = IRT_IGC;
    if (3 < k) {
      IVar8 = IVar6;
    }
    uVar17 = (ushort)IVar7 | (ushort)(IVar8 << 5);
    (J->fold).ins.field_0.ot = (ushort)IVar8 | 0x5900;
    goto LAB_00151c8c;
  case 10:
    goto switchD_001517e9_caseD_a;
  case 0xb:
    (J->fold).ins.field_0.ot = uVar17 | 0x4500;
    (J->fold).ins.field_0.op1 = IVar20;
    (J->fold).ins.field_0.op2 = 0;
    sp = lj_opt_fold(J);
switchD_001517e9_caseD_a:
    if ((IVar6 == IRT_CDATA) || (IVar7 == IRT_CDATA)) goto switchD_001517e9_caseD_3;
    IVar7 = IRT_IGC;
    if (3 < k) {
      IVar7 = IVar6;
    }
    (J->fold).ins.field_0.ot = (ushort)IVar7 | 0x5900;
    (J->fold).ins.field_0.op1 = (IRRef1)sp;
    (J->fold).ins.field_0.op2 = (ushort)(IVar7 << 5) | uVar17 | 0x1000;
LAB_00151c9b:
    sp = lj_opt_fold(J);
    break;
  case 0xd:
  case 0xe:
    if ((k & 8) == 0) {
      uVar18 = 8;
      IVar7 = IRT_U64;
      uVar10 = 0x800000;
      goto switchD_001517e9_caseD_8;
    }
    uVar5 = uVar1 | 0x5900;
    uVar17 = (ushort)(IVar6 << 5) | 9;
    goto LAB_00151c0a;
  case 0x10:
  case 0x11:
    goto switchD_001517e9_caseD_10;
  case 0x12:
    goto switchD_001517e9_caseD_12;
  case 0x13:
    (J->fold).ins.field_0.ot = uVar17 | 0x4500;
    (J->fold).ins.field_0.op1 = IVar20;
    (J->fold).ins.field_0.op2 = 0;
    sp = lj_opt_fold(J);
switchD_001517e9_caseD_12:
    if ((IVar6 == IRT_CDATA) || (IVar7 == IRT_CDATA)) goto switchD_001517e9_caseD_3;
    if (IVar6 == IVar7) break;
    uVar17 = uVar17 | (ushort)(IVar6 << 5);
    (J->fold).ins.field_0.ot = uVar1 | 0x5900;
LAB_00151c8c:
    (J->fold).ins.field_0.op1 = (IRRef1)sp;
    (J->fold).ins.field_0.op2 = uVar17;
    goto LAB_00151c9b;
  case 0x19:
  case 0x1a:
    TVar9 = lj_ir_kint64(J,(ulong)(k >> 1));
    (J->fold).ins.field_0.ot = 0x2909;
    (J->fold).ins.field_0.op1 = IVar16;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
    TVar9 = lj_opt_fold(J);
    TVar12 = lj_ir_knum_u64(J,0);
    (J->fold).ins.field_0.ot = uVar1 | 0x4c00;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar12;
    lj_opt_fold(J);
    if ((uVar10 >> 0x1a & 1) != 0) goto switchD_001517e9_caseD_12;
switchD_001517e9_caseD_10:
    if ((IVar6 == IRT_CDATA) || (IVar7 == IRT_CDATA)) goto switchD_001517e9_caseD_3;
    uVar5 = uVar1 | 0x5900;
    if (uVar18 < 4) {
      IVar7 = IRT_IGC;
    }
    uVar17 = (ushort)(IVar6 << 5) | (ushort)IVar7;
LAB_00151c0a:
    (J->fold).ins.field_0.ot = uVar5;
    (J->fold).ins.field_0.op1 = IVar20;
    (J->fold).ins.field_0.op2 = uVar17;
    goto LAB_00151c9b;
  case 0x1b:
    if ((IVar6 == IRT_CDATA) || (IVar7 == IRT_CDATA)) goto switchD_001517e9_caseD_3;
    (J->fold).ins.field_0.ot = uVar17 | 0x4500;
    (J->fold).ins.field_0.op1 = IVar20;
    (J->fold).ins.field_0.op2 = 0;
    TVar9 = lj_opt_fold(J);
    IVar4 = (IRRef1)TVar9;
    TVar9 = lj_ir_kint64(J,(ulong)(uVar18 >> 1));
    (J->fold).ins.field_0.ot = 0x2909;
    (J->fold).ins.field_0.op1 = IVar20;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
    TVar9 = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = uVar17 | 0x4500;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
    (J->fold).ins.field_0.op2 = 0;
    TVar9 = lj_opt_fold(J);
    IVar20 = (IRRef1)TVar9;
    if (IVar6 != IVar7) {
      uVar17 = uVar17 | (ushort)(IVar6 << 5);
      (J->fold).ins.field_0.ot = uVar1 | 0x5900;
      (J->fold).ins.field_0.op1 = IVar4;
      (J->fold).ins.field_0.op2 = uVar17;
      TVar9 = lj_opt_fold(J);
      IVar4 = (IRRef1)TVar9;
      (J->fold).ins.field_0.ot = uVar1 | 0x5900;
      (J->fold).ins.field_0.op1 = IVar20;
      (J->fold).ins.field_0.op2 = uVar17;
      TVar9 = lj_opt_fold(J);
      IVar20 = (IRRef1)TVar9;
    }
    (J->fold).ins.field_0.ot = uVar1 | 0x4c00;
    (J->fold).ins.field_0.op1 = IVar16;
    (J->fold).ins.field_0.op2 = IVar4;
    lj_opt_fold(J);
    TVar9 = lj_ir_kint64(J,(ulong)(k >> 1));
    (J->fold).ins.field_0.ot = 0x2909;
    (J->fold).ins.field_0.op1 = IVar16;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
    TVar9 = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = uVar1 | 0x4c00;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
    (J->fold).ins.field_0.op2 = IVar20;
    goto LAB_00151cd0;
  case 0x29:
    if (IVar7 == IRT_CDATA) goto switchD_001517e9_caseD_3;
    break;
  case 0x2a:
    if (IVar7 != IRT_CDATA) {
      uVar5 = k == 8 | 0x5914;
      uVar17 = (ushort)(k == 8) << 5 | uVar17 | 0x1280;
      goto LAB_00151c0a;
    }
  default:
switchD_001517e9_caseD_3:
    e = LJ_TRERR_NYICONV;
LAB_001522ba:
    lj_trace_err(J,e);
  case 0x36:
switchD_001517e9_caseD_36:
    if (dp == 0) goto switchD_001517e9_caseD_3;
    TVar9 = lj_ir_kint(J,k);
    crec_copy(J,dp,sp,TVar9,d);
    goto LAB_00151cd5;
  }
  if (dp != 0) {
    (J->fold).ins.field_0.ot = uVar1 | 0x4c00;
    (J->fold).ins.field_0.op1 = IVar16;
    (J->fold).ins.field_0.op2 = (IRRef1)sp;
LAB_00151cd0:
    lj_opt_fold(J);
LAB_00151cd5:
    sp = 0;
  }
  return sp;
}

Assistant:

static TRef crec_ct_tv(jit_State *J, CType *d, TRef dp, TRef sp, cTValue *sval)
{
  CTState *cts = ctype_ctsG(J2G(J));
  CTypeID sid = CTID_P_VOID;
  void *svisnz = 0;
  CType *s;
  if (LJ_LIKELY(tref_isinteger(sp))) {
    sid = CTID_INT32;
    svisnz = (void *)(intptr_t)(tvisint(sval)?(intV(sval)!=0):!tviszero(sval));
  } else if (tref_isnum(sp)) {
    sid = CTID_DOUBLE;
    svisnz = (void *)(intptr_t)(tvisint(sval)?(intV(sval)!=0):!tviszero(sval));
  } else if (tref_isbool(sp)) {
    sp = lj_ir_kint(J, tref_istrue(sp) ? 1 : 0);
    sid = CTID_BOOL;
  } else if (tref_isnil(sp)) {
    sp = lj_ir_kptr(J, NULL);
  } else if (tref_isudata(sp)) {
    GCudata *ud = udataV(sval);
    if (ud->udtype == UDTYPE_IO_FILE) {
      TRef tr = emitir(IRT(IR_FLOAD, IRT_U8), sp, IRFL_UDATA_UDTYPE);
      emitir(IRTGI(IR_EQ), tr, lj_ir_kint(J, UDTYPE_IO_FILE));
      sp = emitir(IRT(IR_FLOAD, IRT_PTR), sp, IRFL_UDATA_FILE);
    } else {
      sp = emitir(IRT(IR_ADD, IRT_PTR), sp, lj_ir_kintp(J, sizeof(GCudata)));
    }
  } else if (tref_isstr(sp)) {
    if (ctype_isenum(d->info)) {  /* Match string against enum constant. */
      GCstr *str = strV(sval);
      CTSize ofs;
      CType *cct = lj_ctype_getfield(cts, d, str, &ofs);
      /* Specialize to the name of the enum constant. */
      emitir(IRTG(IR_EQ, IRT_STR), sp, lj_ir_kstr(J, str));
      if (cct && ctype_isconstval(cct->info)) {
	lj_assertJ(ctype_child(cts, cct)->size == 4,
		   "only 32 bit const supported");  /* NYI */
	svisnz = (void *)(intptr_t)(ofs != 0);
	sp = lj_ir_kint(J, (int32_t)ofs);
	sid = ctype_cid(cct->info);
      }  /* else: interpreter will throw. */
    } else if (ctype_isrefarray(d->info)) {  /* Copy string to array. */
      lj_trace_err(J, LJ_TRERR_BADTYPE);  /* NYI */
    } else {  /* Otherwise pass the string data as a const char[]. */
      /* Don't use STRREF. It folds with SNEW, which loses the trailing NUL. */
      sp = emitir(IRT(IR_ADD, IRT_PTR), sp, lj_ir_kintp(J, sizeof(GCstr)));
      sid = CTID_A_CCHAR;
    }
  } else if (tref_islightud(sp)) {
#if LJ_64
    lj_trace_err(J, LJ_TRERR_NYICONV);
#endif
  } else {  /* NYI: tref_istab(sp). */
    IRType t;
    sid = argv2cdata(J, sp, sval)->ctypeid;
    s = ctype_raw(cts, sid);
    svisnz = cdataptr(cdataV(sval));
    if (ctype_isfunc(s->info)) {
      sid = lj_ctype_intern(cts, CTINFO(CT_PTR, CTALIGN_PTR|sid), CTSIZE_PTR);
      s = ctype_get(cts, sid);
      t = IRT_PTR;
    } else {
      t = crec_ct2irt(cts, s);
    }
    if (ctype_isptr(s->info)) {
      sp = emitir(IRT(IR_FLOAD, t), sp, IRFL_CDATA_PTR);
      if (ctype_isref(s->info)) {
	svisnz = *(void **)svisnz;
	s = ctype_rawchild(cts, s);
	if (ctype_isenum(s->info)) s = ctype_child(cts, s);
	t = crec_ct2irt(cts, s);
      } else {
	goto doconv;
      }
    } else if (t == IRT_I64 || t == IRT_U64) {
      sp = emitir(IRT(IR_FLOAD, t), sp, IRFL_CDATA_INT64);
      lj_needsplit(J);
      goto doconv;
    } else if (t == IRT_INT || t == IRT_U32) {
      if (ctype_isenum(s->info)) s = ctype_child(cts, s);
      sp = emitir(IRT(IR_FLOAD, t), sp, IRFL_CDATA_INT);
      goto doconv;
    } else {
      sp = emitir(IRT(IR_ADD, IRT_PTR), sp, lj_ir_kintp(J, sizeof(GCcdata)));
    }
    if (ctype_isnum(s->info) && t != IRT_CDATA)
      sp = emitir(IRT(IR_XLOAD, t), sp, 0);  /* Load number value. */
    goto doconv;
  }
  s = ctype_get(cts, sid);
doconv:
  if (ctype_isenum(d->info)) d = ctype_child(cts, d);
  return crec_ct_ct(J, d, s, dp, sp, svisnz);
}